

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  cmMakefile *this_00;
  bool bVar1;
  __type _Var2;
  char *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  cmSourceFile *pcVar4;
  string *psVar5;
  reference pbVar6;
  ulong uVar7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string incpath;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  allocator<char> local_99;
  string local_98;
  string local_78;
  cmSourceFile *local_58;
  cmSourceFile *srcFile;
  string *file;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  cmSourceFile *cFile;
  bool found;
  char *path;
  cmDependInformation *info_local;
  cmLBDepend *this_local;
  
  if ((info->DependDone & 1U) == 0) {
    info->DependDone = true;
    filename = (char *)std::__cxx11::string::c_str();
    if (filename == (char *)0x0) {
      cmSystemTools::Error
                ("Attempt to find dependencies for file without path!",(char *)0x0,(char *)0x0,
                 (char *)0x0);
    }
    else {
      cFile._7_1_ = cmsys::SystemTools::FileExists(filename,true);
      if (cFile._7_1_) {
        DependWalk(this,info);
      }
      if (info->SourceFile != (cmSourceFile *)0x0) {
        pcVar4 = info->SourceFile;
        pvVar3 = cmSourceFile::GetDepends_abi_cxx11_(pcVar4);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar3);
        if (!bVar1) {
          pvVar3 = cmSourceFile::GetDepends_abi_cxx11_(pcVar4);
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar3);
          file = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar3);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&file), bVar1) {
            srcFile = (cmSourceFile *)
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            AddDependency(this,info,pcVar8);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          cFile._7_1_ = true;
        }
      }
      if (cFile._7_1_ == false) {
        this_00 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,filename,&local_99);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_78,&local_98);
        pcVar4 = cmMakefile::GetSource(this_00,&local_78,Ambiguous);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        local_58 = pcVar4;
        if (pcVar4 != (cmSourceFile *)0x0) {
          psVar5 = cmSourceFile::GetFullPath(pcVar4,(string *)0x0);
          bVar1 = std::operator==(psVar5,filename);
          if (bVar1) {
            cFile._7_1_ = true;
          }
          else {
            __end4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->IncludeDirectories);
            incpath.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->IncludeDirectories);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)((long)&incpath.field_2 + 8)), bVar1) {
              pbVar6 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end4);
              std::__cxx11::string::string((string *)local_e8,(string *)pbVar6);
              uVar7 = std::__cxx11::string::empty();
              if (((uVar7 & 1) == 0) &&
                 (pcVar8 = (char *)std::__cxx11::string::back(), *pcVar8 != '/')) {
                std::operator+(&local_108,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e8,"/");
                std::__cxx11::string::operator=((string *)local_e8,(string *)&local_108);
                std::__cxx11::string::~string((string *)&local_108);
              }
              std::operator+(&local_128,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e8,filename);
              std::__cxx11::string::operator=((string *)local_e8,(string *)&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              psVar5 = cmSourceFile::GetFullPath(local_58,(string *)0x0);
              _Var2 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_e8);
              if (_Var2) {
                std::__cxx11::string::operator=((string *)&info->FullPath,(string *)local_e8);
                cFile._7_1_ = true;
              }
              std::__cxx11::string::~string((string *)local_e8);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end4);
            }
          }
        }
      }
      if (cFile._7_1_ == false) {
        bVar1 = cmsys::RegularExpression::find
                          (&this->ComplainFileRegularExpression,&info->IncludeName);
        if (bVar1) {
          cmSystemTools::Error
                    ("error cannot find dependencies for ",filename,(char *)0x0,(char *)0x0);
        }
        else {
          std::__cxx11::string::clear();
        }
      }
    }
  }
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const char* path = info->FullPath.c_str();
    if (!path) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file.c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for ", path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }